

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qnetworkinformation_p.cpp
# Opt level: O3

void QNetworkInformationBackend::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  long lVar2;
  int iVar3;
  long in_FS_OFFSET;
  undefined4 local_1c;
  void *local_18;
  undefined4 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == IndexOfMethod) {
    pcVar1 = *_a[1];
    lVar2 = *(long *)((long)_a[1] + 8);
    if (pcVar1 == reachabilityChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar1 == behindCaptivePortalChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (pcVar1 == transportMediumChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 2;
    }
    else if (pcVar1 == isMeteredChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 3;
    }
  }
  else if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      local_1c = *_a[1];
      iVar3 = 0;
      break;
    case 1:
      local_1c = CONCAT31(local_1c._1_3_,*_a[1]);
      iVar3 = 1;
      break;
    case 2:
      local_1c = *_a[1];
      iVar3 = 2;
      break;
    case 3:
      local_1c = CONCAT31(local_1c._1_3_,*_a[1]);
      iVar3 = 3;
      break;
    default:
      goto switchD_001b5b8a_default;
    }
    local_10 = &local_1c;
    local_18 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar3,&local_18);
  }
switchD_001b5b8a_default:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QNetworkInformationBackend::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QNetworkInformationBackend *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->reachabilityChanged((*reinterpret_cast< std::add_pointer_t<QNetworkInformation::Reachability>>(_a[1]))); break;
        case 1: _t->behindCaptivePortalChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 2: _t->transportMediumChanged((*reinterpret_cast< std::add_pointer_t<QNetworkInformation::TransportMedium>>(_a[1]))); break;
        case 3: _t->isMeteredChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QNetworkInformationBackend::*)(QNetworkInformation::Reachability )>(_a, &QNetworkInformationBackend::reachabilityChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkInformationBackend::*)(bool )>(_a, &QNetworkInformationBackend::behindCaptivePortalChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkInformationBackend::*)(QNetworkInformation::TransportMedium )>(_a, &QNetworkInformationBackend::transportMediumChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkInformationBackend::*)(bool )>(_a, &QNetworkInformationBackend::isMeteredChanged, 3))
            return;
    }
}